

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5PoslistOffsetsCallback(Fts5Index *pUnused,void *pContext,u8 *pChunk,int nChunk)

{
  int iVar1;
  u32 local_38;
  int local_34;
  int iVal;
  int i;
  PoslistOffsetsCtx *pCtx;
  u8 *puStack_20;
  int nChunk_local;
  u8 *pChunk_local;
  void *pContext_local;
  Fts5Index *pUnused_local;
  
  if (0 < nChunk) {
    local_34 = 0;
    _iVal = (long *)pContext;
    pCtx._4_4_ = nChunk;
    puStack_20 = pChunk;
    pChunk_local = (u8 *)pContext;
    pContext_local = pUnused;
    while (local_34 < pCtx._4_4_) {
      iVar1 = sqlite3Fts5GetVarint32(puStack_20 + local_34,&local_38);
      local_34 = iVar1 + local_34;
      local_38 = (int)_iVal[2] + -2 + local_38;
      *(u32 *)(_iVal + 2) = local_38;
      iVar1 = fts5IndexColsetTest((Fts5Colset *)_iVal[1],local_38);
      if (iVar1 != 0) {
        iVar1 = sqlite3Fts5PutVarint
                          ((uchar *)(*(long *)*_iVal + (long)*(int *)(*_iVal + 8)),
                           (long)(int)((local_38 + 2) - *(int *)((long)_iVal + 0x14)));
        *(int *)(*_iVal + 8) = iVar1 + *(int *)(*_iVal + 8);
        *(u32 *)((long)_iVal + 0x14) = local_38;
      }
    }
  }
  return;
}

Assistant:

static void fts5PoslistOffsetsCallback(
  Fts5Index *pUnused, 
  void *pContext, 
  const u8 *pChunk, int nChunk
){
  PoslistOffsetsCtx *pCtx = (PoslistOffsetsCtx*)pContext;
  UNUSED_PARAM(pUnused);
  assert_nc( nChunk>=0 );
  if( nChunk>0 ){
    int i = 0;
    while( i<nChunk ){
      int iVal;
      i += fts5GetVarint32(&pChunk[i], iVal);
      iVal += pCtx->iRead - 2;
      pCtx->iRead = iVal;
      if( fts5IndexColsetTest(pCtx->pColset, iVal) ){
        fts5BufferSafeAppendVarint(pCtx->pBuf, iVal + 2 - pCtx->iWrite);
        pCtx->iWrite = iVal;
      }
    }
  }
}